

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O0

void __thiscall ltc::set_ltc_parameters(ltc *this,vec3 *parameters)

{
  float *pfVar1;
  vec<3,_float,_(glm::precision)0> local_74;
  vec<3,_float,_(glm::precision)0> local_68;
  vec<3,_float,_(glm::precision)0> local_5c;
  mat<3,_3,_float,_(glm::precision)0> local_50;
  float local_2c;
  float local_28;
  float c;
  float local_20;
  float b;
  vec3 *pvStack_18;
  float a;
  vec3 *parameters_local;
  ltc *this_local;
  
  local_20 = 1e-07;
  pvStack_18 = parameters;
  parameters_local = (vec3 *)this;
  pfVar1 = std::max<float>(&local_20,(float *)parameters);
  b = *pfVar1;
  local_28 = 1e-07;
  pfVar1 = std::max<float>(&local_28,&(pvStack_18->field_0).field_0.y);
  c = *pfVar1;
  local_2c = (pvStack_18->field_0).field_0.z;
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_5c,b,0.0,0.0);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_68,0.0,c,0.0);
  glm::vec<3,_float,_(glm::precision)0>::vec(&local_74,local_2c,0.0,1.0);
  glm::mat<3,_3,_float,_(glm::precision)0>::mat(&local_50,&local_5c,&local_68,&local_74);
  set_ltc_matrix(this,&local_50);
  return;
}

Assistant:

void ltc::set_ltc_parameters(const glm::vec3 &parameters)
{
  // Safeguard against really low parameters which will result in irreversible ltc matrix.
  float a = std::max(1e-7f, parameters.x);
  float b = std::max(1e-7f, parameters.y);
  float c = parameters.z;

  set_ltc_matrix({
    {a,    0.0f, 0.0f},
    {0.0f, b,    0.0f},
    {c,    0.0f, 1.0f}
  });
}